

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::AddNodePrefixesChecked
               (aiNode *node,char *prefix,uint len,
               vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *input,uint cur)

{
  ai_uint32 aVar1;
  pointer pSVar2;
  _Base_ptr p_Var3;
  uint32_t uVar4;
  Logger *this;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  _Rb_tree_header *p_Var8;
  char *data;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  bool bVar11;
  
  data = (node->mName).data;
  uVar6 = 0;
  uVar4 = SuperFastHash(data,(node->mName).length,0);
  pSVar2 = (input->super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(input->
                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2;
  if (lVar7 != 0) {
    uVar5 = (lVar7 >> 5) * -0x5555555555555555;
    do {
      if ((uint)uVar6 != cur) {
        p_Var8 = (_Rb_tree_header *)((long)&pSVar2[uVar6].hashes._M_t._M_impl + 8);
        p_Var9 = (_Base_ptr)p_Var8;
        for (p_Var3 = *(_Base_ptr *)((long)&pSVar2[uVar6].hashes._M_t._M_impl + 0x10);
            (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0; p_Var3 = (&p_Var3->_M_left)[bVar11]
            ) {
          bVar11 = (uint)*(size_t *)(p_Var3 + 1) < uVar4;
          if (!bVar11) {
            p_Var9 = p_Var3;
          }
        }
        p_Var10 = p_Var8;
        if (((_Rb_tree_header *)p_Var9 != p_Var8) &&
           (p_Var10 = (_Rb_tree_header *)p_Var9,
           uVar4 < (uint)((_Rb_tree_header *)p_Var9)->_M_node_count)) {
          p_Var10 = p_Var8;
        }
        if (p_Var10 != p_Var8) {
          aVar1 = (node->mName).length;
          if ((aVar1 == 0) || ((node->mName).data[0] != '$')) {
            if (aVar1 + len < 0x3ff) {
              memmove(data + len,data,(ulong)(aVar1 + 1));
              memcpy(data,prefix,(ulong)len);
              (node->mName).length = (node->mName).length + len;
            }
            else {
              this = DefaultLogger::get();
              Logger::debug(this,"Can\'t add an unique prefix because the string is too long");
            }
          }
          break;
        }
      }
      uVar6 = (ulong)((uint)uVar6 + 1);
    } while (uVar6 <= uVar5 && uVar5 - uVar6 != 0);
  }
  if (node->mNumChildren != 0) {
    uVar6 = 0;
    do {
      AddNodePrefixesChecked(node->mChildren[uVar6],prefix,len,input,cur);
      uVar6 = uVar6 + 1;
    } while (uVar6 < node->mNumChildren);
  }
  return;
}

Assistant:

void SceneCombiner::AddNodePrefixesChecked(aiNode* node, const char* prefix, unsigned int len,
        std::vector<SceneHelper>& input, unsigned int cur) {
    ai_assert(NULL != prefix);
    const unsigned int hash = SuperFastHash(node->mName.data, static_cast<uint32_t>(node->mName.length));

    // Check whether we find a positive match in one of the given sets
    for (unsigned int i = 0; i < input.size(); ++i) {
        if (cur != i && input[i].hashes.find(hash) != input[i].hashes.end()) {
            PrefixString(node->mName,prefix,len);
            break;
        }
    }

    // Process all children recursively
    for (unsigned int i = 0; i < node->mNumChildren;++i)
        AddNodePrefixesChecked(node->mChildren[i],prefix,len,input,cur);
}